

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrefcnt.cpp
# Opt level: O0

CVmWeakRefable * __thiscall CVmWeakRef::ref(CVmWeakRef *this)

{
  CVmWeakRefable *pCVar1;
  long in_RDI;
  CVmWeakRefable *r;
  
  OS_Mutex::lock((OS_Mutex *)0x3810ab);
  pCVar1 = *(CVmWeakRefable **)(in_RDI + 0x10);
  if (pCVar1 != (CVmWeakRefable *)0x0) {
    CVmRefCntObj::add_ref((CVmRefCntObj *)0x3810ca);
  }
  OS_Mutex::unlock((OS_Mutex *)0x3810d7);
  return pCVar1;
}

Assistant:

CVmWeakRefable *CVmWeakRef::ref()
{
    /* lock the mutex while we're working */
    mu->lock();

    /* get the object */
    CVmWeakRefable *r = ref_;

    /* 
     *   If we still have a reference to the object, it means it's still in
     *   memory and still has at least one other referencer.  As long as we
     *   have the mutex locked, it's impossible for anyone else to release
     *   their reference, so the object definitely will stay around at least
     *   until we unlock the mutex.
     *   
     *   Add a strong reference on behalf of our caller.  This ensures that
     *   the object lives on for at least as long as the caller needs it,
     *   because whatever else happens, they have a strong reference on it
     *   starting now.  Even if another thread releases the last pre-existing
     *   reference on the object the moment we unlock the mutex, it doesn't
     *   matter: before unlocking the mutex, we add our caller's strong
     *   reference.  
     */
    if (r != 0)
        r->add_ref();
    
    /* done with the mutex */
    mu->unlock();
    
    /* return the object */
    return r;
}